

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

void __thiscall llbuild::buildsystem::Tool::~Tool(Tool *this)

{
  this->_vptr_Tool = (_func_int **)&PTR__Tool_0022c740;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

Tool::~Tool() {}